

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O1

FT_Error TT_Vary_Apply_Glyph_Deltas
                   (TT_Face face,FT_UInt glyph_index,FT_Outline *outline,FT_UInt n_points)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  ushort uVar4;
  undefined8 uVar5;
  FT_Outline *pFVar6;
  FT_UShort FVar7;
  FT_UShort FVar8;
  int iVar9;
  FT_Vector *pFVar10;
  FT_Bool *has_delta;
  FT_Fixed *pFVar11;
  uchar *puVar12;
  FT_Fixed FVar13;
  FT_UShort *pFVar14;
  uchar *puVar15;
  FT_Memory pFVar16;
  long lVar17;
  FT_Bool *pFVar18;
  long lVar19;
  FT_UInt delta_cnt;
  ulong uVar20;
  FT_Vector *pFVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  FT_Fixed *pFVar25;
  uchar *puVar26;
  FT_Stream pFVar27;
  GX_Blend pGVar28;
  FT_Error error;
  FT_UInt spoint_count;
  FT_UInt point_count;
  uint local_13c;
  FT_Memory local_138;
  FT_UShort local_12a;
  FT_Fixed *local_128;
  FT_Vector *local_120;
  FT_Vector *local_118;
  FT_Short *local_110;
  FT_Fixed *local_108;
  ulong local_100;
  FT_Stream local_f8;
  FT_UShort *local_f0;
  FT_UInt local_e8;
  uint local_e4;
  FT_UShort *local_e0;
  FT_Short *local_d8;
  FT_Fixed *local_d0;
  ulong local_c8;
  uchar *local_c0;
  ulong local_b8;
  FT_Outline *local_b0;
  GX_Blend local_a8;
  ulong local_a0;
  long local_98;
  FT_Fixed local_90;
  ulong local_88;
  TT_Face local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  long local_50;
  uchar *local_48;
  uchar *local_40;
  long local_38;
  
  local_f8 = (face->root).stream;
  local_138 = local_f8->memory;
  local_a8 = face->blend;
  local_e8 = 0;
  pFVar11 = (FT_Fixed *)0x6;
  if ((local_a8 != (GX_Blend)0x0 && face->doblend != '\0') &&
     (pFVar11 = (FT_Fixed *)0x0, glyph_index < local_a8->gv_glyphcnt)) {
    if (local_a8->glyphoffsets[glyph_index] != local_a8->glyphoffsets[glyph_index + 1]) {
      uVar20 = (ulong)n_points;
      has_delta = (FT_Bool *)0x0;
      local_b0 = outline;
      local_80 = face;
      pFVar10 = (FT_Vector *)
                ft_mem_realloc(local_138,0x10,0,uVar20,(void *)0x0,(FT_Error *)&local_13c);
      pFVar16 = local_138;
      pFVar21 = (FT_Vector *)0x0;
      if (local_13c == 0) {
        local_118 = pFVar10;
        local_100 = (ulong)n_points;
        local_120 = (FT_Vector *)
                    ft_mem_realloc(local_138,0x10,0,uVar20,(void *)0x0,(FT_Error *)&local_13c);
        if (local_13c == 0) {
          has_delta = (FT_Bool *)
                      ft_mem_realloc(pFVar16,1,0,uVar20,(void *)0x0,(FT_Error *)&local_13c);
          pGVar28 = local_a8;
          pFVar27 = local_f8;
          pFVar10 = local_118;
          pFVar16 = local_138;
          pFVar21 = local_120;
          if (((local_13c == 0) &&
              (local_b8 = uVar20,
              local_13c = FT_Stream_Seek(local_f8,local_a8->glyphoffsets[glyph_index]),
              pFVar10 = local_118, pFVar16 = local_138, pFVar21 = local_120, local_13c == 0)) &&
             (local_13c = FT_Stream_EnterFrame
                                    (pFVar27,pGVar28->glyphoffsets[glyph_index + 1] -
                                             pGVar28->glyphoffsets[glyph_index]),
             pFVar10 = local_118, pFVar16 = local_138, pFVar21 = local_120, local_13c == 0)) {
            puVar26 = pFVar27->cursor;
            puVar15 = pFVar27->base;
            local_d0 = (FT_Fixed *)0x0;
            pFVar11 = (FT_Fixed *)
                      ft_mem_realloc(local_138,8,0,(ulong)pGVar28->num_axis,(void *)0x0,
                                     (FT_Error *)&local_13c);
            pFVar14 = (FT_UShort *)0x0;
            pFVar25 = (FT_Fixed *)0x0;
            if (local_13c == 0) {
              local_128 = pFVar11;
              local_d0 = (FT_Fixed *)
                         ft_mem_realloc(local_138,8,0,(ulong)pGVar28->num_axis,(void *)0x0,
                                        (FT_Error *)&local_13c);
              if (local_13c == 0) {
                local_108 = (FT_Fixed *)
                            ft_mem_realloc(local_138,8,0,(ulong)pGVar28->num_axis,(void *)0x0,
                                           (FT_Error *)&local_13c);
                if (local_13c == 0) {
                  FVar7 = FT_Stream_GetUShort(pFVar27);
                  FVar8 = FT_Stream_GetUShort(pFVar27);
                  pFVar27 = local_f8;
                  local_88 = (ulong)(FVar7 & 0xfff);
                  uVar20 = pGVar28->gvar_size;
                  if (uVar20 < (ulong)FVar8 + local_88 * 4) {
                    local_13c = 8;
                    pFVar11 = local_128;
                    pFVar14 = (FT_UShort *)0x0;
                    pFVar25 = local_108;
                  }
                  else {
                    puVar26 = puVar26 + ((ulong)FVar8 - (long)puVar15);
                    if ((short)FVar7 < 0) {
                      puVar15 = local_f8->base;
                      uVar24 = (long)local_f8->cursor - (long)puVar15;
                      puVar12 = puVar15 + (long)puVar26;
                      if (local_f8->limit + -(long)puVar15 <= puVar26) {
                        puVar12 = local_f8->limit;
                      }
                      local_f8->cursor = puVar12;
                      local_f0 = ft_var_readpackedpoints(local_f8,uVar20,&local_e8);
                      puVar15 = pFVar27->base;
                      puVar26 = pFVar27->cursor + -(long)puVar15;
                      puVar12 = puVar15 + uVar24;
                      if ((ulong)((long)pFVar27->limit - (long)puVar15) <= uVar24) {
                        puVar12 = pFVar27->limit;
                      }
                      pFVar27->cursor = puVar12;
                    }
                    else {
                      local_f0 = (FT_UShort *)0x0;
                    }
                    if ((FT_UInt)local_100 != 0) {
                      lVar17 = 0;
                      do {
                        puVar1 = (undefined8 *)((long)&local_b0->points->x + lVar17);
                        uVar5 = puVar1[1];
                        puVar2 = (undefined8 *)((long)&local_118->x + lVar17);
                        *puVar2 = *puVar1;
                        puVar2[1] = uVar5;
                        lVar17 = lVar17 + 0x10;
                      } while (local_b8 << 4 != lVar17);
                    }
                    pFVar11 = local_128;
                    pFVar14 = local_f0;
                    pFVar25 = local_108;
                    pFVar27 = local_f8;
                    if ((uint)local_88 != 0) {
                      local_a0 = (ulong)((FT_UInt)local_100 - 4);
                      local_58 = (ulong)((FT_UInt)local_100 - 3);
                      local_68 = (ulong)((FT_UInt)local_100 - 2);
                      local_70 = (ulong)((FT_UInt)local_100 - 1);
                      local_98 = local_b8 << 4;
                      local_60 = local_70 << 4;
                      local_50 = local_68 << 4;
                      local_38 = local_58 << 4;
                      local_78 = local_a0 << 4;
                      uVar20 = 0;
                      local_e0 = (FT_UShort *)0x0;
                      pGVar28 = local_a8;
                      do {
                        FVar7 = FT_Stream_GetUShort(pFVar27);
                        FVar8 = FT_Stream_GetUShort(pFVar27);
                        pFVar25 = local_d0;
                        pFVar11 = local_128;
                        local_110 = (FT_Short *)CONCAT44(local_110._4_4_,(uint)FVar8);
                        local_12a = FVar7;
                        local_c0 = puVar26;
                        if ((short)FVar8 < 0) {
                          local_c8 = uVar20;
                          if (pGVar28->num_axis != 0) {
                            uVar24 = 0;
                            do {
                              FVar7 = FT_Stream_GetUShort(pFVar27);
                              pFVar11[uVar24] = (long)((int)(short)FVar7 << 2);
                              uVar24 = uVar24 + 1;
                            } while (uVar24 < pGVar28->num_axis);
                          }
LAB_00172aec:
                          pFVar11 = local_108;
                          if (((uint)local_110 >> 0xe & 1) != 0) {
                            if (pGVar28->num_axis != 0) {
                              uVar20 = 0;
                              do {
                                FVar7 = FT_Stream_GetUShort(pFVar27);
                                pFVar25[uVar20] = (long)((int)(short)FVar7 << 2);
                                uVar20 = uVar20 + 1;
                              } while (uVar20 < pGVar28->num_axis);
                            }
                            if (pGVar28->num_axis != 0) {
                              uVar20 = 0;
                              do {
                                FVar7 = FT_Stream_GetUShort(pFVar27);
                                pFVar11[uVar20] = (long)((int)(short)FVar7 << 2);
                                uVar20 = uVar20 + 1;
                              } while (uVar20 < pGVar28->num_axis);
                            }
                          }
                          uVar22 = (uint)local_110;
                          FVar13 = ft_var_apply_tuple(pGVar28,(FT_UShort)local_110,local_128,pFVar25
                                                      ,pFVar11);
                          if (FVar13 == 0) {
                            puVar26 = local_c0 + local_12a;
                            iVar9 = 0xf;
                            uVar20 = local_c8;
                          }
                          else {
                            local_48 = pFVar27->base;
                            local_40 = pFVar27->cursor;
                            puVar26 = local_48 + (long)local_c0;
                            if (pFVar27->limit + -(long)local_48 <= local_c0) {
                              puVar26 = pFVar27->limit;
                            }
                            pFVar27->cursor = puVar26;
                            local_90 = FVar13;
                            if ((uVar22 >> 0xd & 1) == 0) {
                              local_e4 = local_e8;
                              pFVar14 = local_f0;
                            }
                            else {
                              pFVar14 = ft_var_readpackedpoints
                                                  (pFVar27,pGVar28->gvar_size,&local_e4);
                              local_e0 = pFVar14;
                            }
                            uVar20 = (ulong)local_e4;
                            delta_cnt = local_e4;
                            if (uVar20 == 0) {
                              delta_cnt = (FT_UInt)local_100;
                            }
                            local_d8 = ft_var_readpackeddeltas(pFVar27,pGVar28->gvar_size,delta_cnt)
                            ;
                            local_110 = ft_var_readpackeddeltas
                                                  (pFVar27,pGVar28->gvar_size,delta_cnt);
                            pFVar6 = local_b0;
                            pFVar10 = local_118;
                            if (((pFVar14 != (FT_UShort *)0x0) && (local_110 != (FT_Short *)0x0)) &&
                               (local_d8 != (FT_Short *)0x0)) {
                              uVar22 = (FT_UInt)local_100;
                              if (pFVar14 == (FT_UShort *)0xffffffffffffffff) {
                                if ((FT_UInt)local_100 != 0) {
                                  lVar17 = 0;
                                  uVar20 = 0;
                                  do {
                                    lVar23 = (long)local_d8[uVar20] * (long)(int)local_90;
                                    lVar23 = lVar23 + 0x8000 + (lVar23 >> 0x3f) >> 0x10;
                                    lVar19 = (long)local_110[uVar20] * (long)(int)local_90;
                                    lVar19 = lVar19 + 0x8000 + (lVar19 >> 0x3f) >> 0x10;
                                    if (uVar20 < local_a0) {
                                      pFVar10 = local_b0->points;
                                      plVar3 = (long *)((long)&pFVar10->x + lVar17);
                                      *plVar3 = *plVar3 + lVar23;
                                      pFVar10 = (FT_Vector *)&pFVar10[uVar20].y;
                                      lVar23 = lVar19;
LAB_00172f37:
                                      pFVar10->x = pFVar10->x + lVar23;
                                    }
                                    else {
                                      if ((uVar20 == local_a0) &&
                                         ((local_80->variation_support & 4) == 0)) {
                                        pFVar10 = (FT_Vector *)((long)&local_b0->points->x + lVar17)
                                        ;
                                        goto LAB_00172f37;
                                      }
                                      if ((local_58 == uVar20) &&
                                         ((local_80->variation_support & 2) == 0)) {
                                        pFVar10 = local_b0->points + uVar20;
                                        goto LAB_00172f37;
                                      }
                                      if (((local_68 == uVar20) &&
                                          ((local_80->variation_support & 0x20) == 0)) ||
                                         ((local_70 == uVar20 &&
                                          ((local_80->variation_support & 0x10) == 0)))) {
                                        pFVar10 = (FT_Vector *)&local_b0->points[uVar20].y;
                                        lVar23 = lVar19;
                                        goto LAB_00172f37;
                                      }
                                    }
                                    uVar20 = uVar20 + 1;
                                    lVar17 = lVar17 + 0x10;
                                  } while (local_b8 != uVar20);
                                }
                              }
                              else {
                                if ((FT_UInt)local_100 != 0) {
                                  lVar17 = 0;
                                  pFVar18 = has_delta;
                                  do {
                                    *pFVar18 = '\0';
                                    puVar1 = (undefined8 *)((long)&local_118->x + lVar17);
                                    uVar5 = puVar1[1];
                                    puVar2 = (undefined8 *)((long)&local_120->x + lVar17);
                                    *puVar2 = *puVar1;
                                    puVar2[1] = uVar5;
                                    pFVar18 = pFVar18 + 1;
                                    lVar17 = lVar17 + 0x10;
                                  } while (local_98 != lVar17);
                                }
                                if (uVar20 != 0) {
                                  uVar24 = 0;
                                  do {
                                    uVar4 = pFVar14[uVar24];
                                    if (uVar4 < (FT_UInt)local_100) {
                                      has_delta[uVar4] = '\x01';
                                      lVar17 = (long)local_d8[uVar24] * (long)(int)local_90;
                                      local_120[uVar4].x =
                                           local_120[uVar4].x +
                                           (lVar17 + 0x8000 + (lVar17 >> 0x3f) >> 0x10);
                                      lVar17 = (long)local_110[uVar24] * (long)(int)local_90;
                                      local_120[uVar4].y =
                                           local_120[uVar4].y +
                                           (lVar17 + 0x8000 + (lVar17 >> 0x3f) >> 0x10);
                                    }
                                    uVar24 = uVar24 + 1;
                                  } while (uVar20 != uVar24);
                                }
                                tt_interpolate_deltas(local_b0,local_120,local_118,has_delta);
                                if (uVar22 != 0) {
                                  lVar17 = 0;
                                  uVar20 = 0;
                                  do {
                                    lVar23 = *(long *)((long)&local_120->x + lVar17) -
                                             *(long *)((long)&pFVar10->x + lVar17);
                                    lVar19 = *(long *)((long)&local_120->y + lVar17) -
                                             *(long *)((long)&pFVar10->y + lVar17);
                                    if (uVar20 < local_a0) {
                                      pFVar21 = pFVar6->points;
                                      plVar3 = (long *)((long)&pFVar21->x + lVar17);
                                      *plVar3 = *plVar3 + lVar23;
                                      pFVar21 = (FT_Vector *)&pFVar21[uVar20].y;
                                      lVar23 = lVar19;
LAB_00172e14:
                                      pFVar21->x = pFVar21->x + lVar23;
                                    }
                                    else {
                                      if ((local_78 == lVar17) &&
                                         ((local_80->variation_support & 4) == 0)) {
                                        pFVar21 = (FT_Vector *)((long)&pFVar6->points->x + lVar17);
                                        goto LAB_00172e14;
                                      }
                                      if ((local_38 == lVar17) &&
                                         ((local_80->variation_support & 2) == 0)) {
                                        pFVar21 = pFVar6->points + uVar20;
                                        goto LAB_00172e14;
                                      }
                                      if (((local_50 == lVar17) &&
                                          ((local_80->variation_support & 0x20) == 0)) ||
                                         ((local_60 == lVar17 &&
                                          ((local_80->variation_support & 0x10) == 0)))) {
                                        pFVar21 = (FT_Vector *)&pFVar6->points[uVar20].y;
                                        lVar23 = lVar19;
                                        goto LAB_00172e14;
                                      }
                                    }
                                    uVar20 = uVar20 + 1;
                                    lVar17 = lVar17 + 0x10;
                                  } while (local_98 != lVar17);
                                }
                              }
                            }
                            if (local_e0 == (FT_UShort *)0xffffffffffffffff) {
                              local_e0 = (FT_UShort *)0xffffffffffffffff;
                            }
                            else {
                              ft_mem_free(local_138,local_e0);
                              local_e0 = (FT_UShort *)0x0;
                            }
                            pFVar16 = local_138;
                            uVar20 = (long)local_40 - (long)local_48;
                            ft_mem_free(local_138,local_d8);
                            ft_mem_free(pFVar16,local_110);
                            puVar26 = local_c0 + local_12a;
                            puVar15 = local_f8->base + uVar20;
                            if ((ulong)((long)local_f8->limit - (long)local_f8->base) <= uVar20) {
                              puVar15 = local_f8->limit;
                            }
                            local_f8->cursor = puVar15;
                            iVar9 = 0;
                            uVar20 = local_c8;
                            pFVar27 = local_f8;
                            pGVar28 = local_a8;
                          }
                        }
                        else {
                          uVar22 = FVar8 & 0xfff;
                          if (uVar22 < pGVar28->tuplecount) {
                            local_c8 = uVar20;
                            memcpy(local_128,pGVar28->tuplecoords + uVar22 * pGVar28->num_axis,
                                   (ulong)pGVar28->num_axis << 3);
                            pFVar25 = local_d0;
                            goto LAB_00172aec;
                          }
                          local_13c = 8;
                          iVar9 = 5;
                        }
                        pFVar11 = local_128;
                        pFVar14 = local_f0;
                        pFVar25 = local_108;
                        if ((iVar9 != 0) && (iVar9 != 0xf)) {
                          if (iVar9 != 5) goto LAB_001727e4;
                          break;
                        }
                        uVar22 = (int)uVar20 + 1;
                        uVar20 = (ulong)uVar22;
                      } while (uVar22 != (uint)local_88);
                    }
                  }
                }
                else {
                  pFVar11 = local_128;
                  pFVar14 = (FT_UShort *)0x0;
                  pFVar25 = local_108;
                }
              }
              else {
                pFVar11 = local_128;
                pFVar14 = (FT_UShort *)0x0;
                pFVar25 = (FT_Fixed *)0x0;
              }
            }
            pFVar16 = local_138;
            if (pFVar14 != (FT_UShort *)0xffffffffffffffff) {
              ft_mem_free(local_138,pFVar14);
            }
            ft_mem_free(pFVar16,pFVar11);
            ft_mem_free(pFVar16,local_d0);
            ft_mem_free(pFVar16,pFVar25);
            FT_Stream_ExitFrame(pFVar27);
            pFVar10 = local_118;
            pFVar21 = local_120;
          }
        }
        else {
          has_delta = (FT_Bool *)0x0;
          pFVar10 = local_118;
          pFVar21 = local_120;
        }
      }
      ft_mem_free(pFVar16,pFVar10);
      ft_mem_free(pFVar16,pFVar21);
      ft_mem_free(pFVar16,has_delta);
      pFVar11 = (FT_Fixed *)(ulong)local_13c;
    }
  }
LAB_001727e4:
  return (FT_Error)pFVar11;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Vary_Apply_Glyph_Deltas( TT_Face      face,
                              FT_UInt      glyph_index,
                              FT_Outline*  outline,
                              FT_UInt      n_points )
  {
    FT_Stream   stream = face->root.stream;
    FT_Memory   memory = stream->memory;
    GX_Blend    blend  = face->blend;

    FT_Vector*  points_org = NULL;
    FT_Vector*  points_out = NULL;
    FT_Bool*    has_delta  = NULL;

    FT_Error    error;
    FT_ULong    glyph_start;
    FT_UInt     tupleCount;
    FT_ULong    offsetToData;
    FT_ULong    here;
    FT_UInt     i, j;
    FT_Fixed*   tuple_coords    = NULL;
    FT_Fixed*   im_start_coords = NULL;
    FT_Fixed*   im_end_coords   = NULL;
    FT_UInt     point_count, spoint_count = 0;
    FT_UShort*  sharedpoints = NULL;
    FT_UShort*  localpoints  = NULL;
    FT_UShort*  points;
    FT_Short    *deltas_x, *deltas_y;


    if ( !face->doblend || !blend )
      return FT_THROW( Invalid_Argument );

    if ( glyph_index >= blend->gv_glyphcnt      ||
         blend->glyphoffsets[glyph_index] ==
           blend->glyphoffsets[glyph_index + 1] )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " no variation data for this glyph\n" ));
      return FT_Err_Ok;
    }

    if ( FT_NEW_ARRAY( points_org, n_points ) ||
         FT_NEW_ARRAY( points_out, n_points ) ||
         FT_NEW_ARRAY( has_delta, n_points )  )
      goto Fail1;

    if ( FT_STREAM_SEEK( blend->glyphoffsets[glyph_index] )   ||
         FT_FRAME_ENTER( blend->glyphoffsets[glyph_index + 1] -
                           blend->glyphoffsets[glyph_index] ) )
      goto Fail1;

    glyph_start = FT_Stream_FTell( stream );

    /* each set of glyph variation data is formatted similarly to `cvar' */

    if ( FT_NEW_ARRAY( tuple_coords, blend->num_axis )    ||
         FT_NEW_ARRAY( im_start_coords, blend->num_axis ) ||
         FT_NEW_ARRAY( im_end_coords, blend->num_axis )   )
      goto Fail2;

    tupleCount   = FT_GET_USHORT();
    offsetToData = FT_GET_USHORT();

    /* rough sanity test */
    if ( offsetToData + ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) * 4 >
           blend->gvar_size )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " invalid glyph variation array header\n" ));

      error = FT_THROW( Invalid_Table );
      goto Fail2;
    }

    offsetToData += glyph_start;

    if ( tupleCount & GX_TC_TUPLES_SHARE_POINT_NUMBERS )
    {
      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      sharedpoints = ft_var_readpackedpoints( stream,
                                              blend->gvar_size,
                                              &spoint_count );
      offsetToData = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "gvar: there %s %d tuple%s:\n",
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "is" : "are",
                tupleCount & GX_TC_TUPLE_COUNT_MASK,
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "" : "s" ));

    for ( j = 0; j < n_points; j++ )
      points_org[j] = outline->points[j];

    for ( i = 0; i < ( tupleCount & GX_TC_TUPLE_COUNT_MASK ); i++ )
    {
      FT_UInt   tupleDataSize;
      FT_UInt   tupleIndex;
      FT_Fixed  apply;


      FT_TRACE6(( "  tuple %d:\n", i ));

      tupleDataSize = FT_GET_USHORT();
      tupleIndex    = FT_GET_USHORT();

      if ( tupleIndex & GX_TI_EMBEDDED_TUPLE_COORD )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          tuple_coords[j] = FT_GET_SHORT() * 4;   /* convert from        */
                                                  /* short frac to fixed */
      }
      else if ( ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) >= blend->tuplecount )
      {
        FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                    " invalid tuple index\n" ));

        error = FT_THROW( Invalid_Table );
        goto Fail2;
      }
      else
        FT_MEM_COPY(
          tuple_coords,
          &blend->tuplecoords[( tupleIndex & 0xFFF ) * blend->num_axis],
          blend->num_axis * sizeof ( FT_Fixed ) );

      if ( tupleIndex & GX_TI_INTERMEDIATE_TUPLE )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          im_start_coords[j] = FT_GET_SHORT() * 4;
        for ( j = 0; j < blend->num_axis; j++ )
          im_end_coords[j] = FT_GET_SHORT() * 4;
      }

      apply = ft_var_apply_tuple( blend,
                                  (FT_UShort)tupleIndex,
                                  tuple_coords,
                                  im_start_coords,
                                  im_end_coords );

      if ( apply == 0 )              /* tuple isn't active for our blend */
      {
        offsetToData += tupleDataSize;
        continue;
      }

      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      if ( tupleIndex & GX_TI_PRIVATE_POINT_NUMBERS )
      {
        localpoints = ft_var_readpackedpoints( stream,
                                               blend->gvar_size,
                                               &point_count );
        points      = localpoints;
      }
      else
      {
        points      = sharedpoints;
        point_count = spoint_count;
      }

      deltas_x = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );
      deltas_y = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );

      if ( !points || !deltas_y || !deltas_x )
        ; /* failure, ignore it */

      else if ( points == ALL_POINTS )
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    point deltas:\n" ));

        /* this means that there are deltas for every point in the glyph */
        for ( j = 0; j < n_points; j++ )
        {
          FT_Pos  delta_x = FT_MulFix( deltas_x[j], apply );
          FT_Pos  delta_y = FT_MulFix( deltas_y[j], apply );


          if ( j < n_points - 4 )
          {
            outline->points[j].x += delta_x;
            outline->points[j].y += delta_y;
          }
          else
          {
            /* To avoid double adjustment of advance width or height, */
            /* adjust phantom points only if there is no HVAR or VVAR */
            /* support, respectively.                                 */
            if ( j == ( n_points - 4 )        &&
                 !( face->variation_support &
                    TT_FACE_FLAG_VAR_LSB    ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 3 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_HADVANCE ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 2 )        &&
                      !( face->variation_support &
                         TT_FACE_FLAG_VAR_TSB    ) )
              outline->points[j].y += delta_y;

            else if ( j == ( n_points - 1 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_VADVANCE ) )
              outline->points[j].y += delta_y;
          }

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( delta_x || delta_y )
          {
            FT_TRACE7(( "      %d: (%d, %d) -> (%d, %d)\n",
                        j,
                        outline->points[j].x - delta_x,
                        outline->points[j].y - delta_y,
                        outline->points[j].x,
                        outline->points[j].y ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      else
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        /* we have to interpolate the missing deltas similar to the */
        /* IUP bytecode instruction                                 */
        for ( j = 0; j < n_points; j++ )
        {
          has_delta[j]  = FALSE;
          points_out[j] = points_org[j];
        }

        for ( j = 0; j < point_count; j++ )
        {
          FT_UShort  idx = points[j];


          if ( idx >= n_points )
            continue;

          has_delta[idx] = TRUE;

          points_out[idx].x += FT_MulFix( deltas_x[j], apply );
          points_out[idx].y += FT_MulFix( deltas_y[j], apply );
        }

        /* no need to handle phantom points here,      */
        /* since solitary points can't be interpolated */
        tt_interpolate_deltas( outline,
                               points_out,
                               points_org,
                               has_delta );

        FT_TRACE7(( "    point deltas:\n" ));

        for ( j = 0; j < n_points; j++ )
        {
          FT_Pos  delta_x = points_out[j].x - points_org[j].x;
          FT_Pos  delta_y = points_out[j].y - points_org[j].y;


          if ( j < n_points - 4 )
          {
            outline->points[j].x += delta_x;
            outline->points[j].y += delta_y;
          }
          else
          {
            /* To avoid double adjustment of advance width or height, */
            /* adjust phantom points only if there is no HVAR or VVAR */
            /* support, respectively.                                 */
            if ( j == ( n_points - 4 )        &&
                 !( face->variation_support &
                    TT_FACE_FLAG_VAR_LSB    ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 3 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_HADVANCE ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 2 )        &&
                      !( face->variation_support &
                         TT_FACE_FLAG_VAR_TSB    ) )
              outline->points[j].y += delta_y;

            else if ( j == ( n_points - 1 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_VADVANCE ) )
              outline->points[j].y += delta_y;
          }

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( delta_x || delta_y )
          {
            FT_TRACE7(( "      %d: (%d, %d) -> (%d, %d)\n",
                        j,
                        outline->points[j].x - delta_x,
                        outline->points[j].y - delta_y,
                        outline->points[j].x,
                        outline->points[j].y ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      if ( localpoints != ALL_POINTS )
        FT_FREE( localpoints );
      FT_FREE( deltas_x );
      FT_FREE( deltas_y );

      offsetToData += tupleDataSize;

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "\n" ));

  Fail2:
    if ( sharedpoints != ALL_POINTS )
      FT_FREE( sharedpoints );
    FT_FREE( tuple_coords );
    FT_FREE( im_start_coords );
    FT_FREE( im_end_coords );

    FT_FRAME_EXIT();

  Fail1:
    FT_FREE( points_org );
    FT_FREE( points_out );
    FT_FREE( has_delta );

    return error;
  }